

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_context_open_pcm__alsa
                    (ma_context *pContext,ma_share_mode shareMode,ma_device_type deviceType,
                    ma_device_id *pDeviceID,wchar_t openMode,ma_snd_pcm_t **ppPCM)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  wchar_t wVar4;
  ma_result mVar5;
  ma_log *pmVar6;
  char local_298 [8];
  char hwid [256];
  int local_18c;
  char local_188;
  char local_187;
  wchar_t resultALSA;
  ma_device_id_conflict deviceID;
  char *defaultDeviceNames [7];
  size_t i;
  ma_bool32 isDeviceOpen;
  ma_snd_pcm_stream_t stream;
  ma_snd_pcm_t *pPCM;
  ma_snd_pcm_t **ppPCM_local;
  ma_device_id *pmStack_28;
  wchar_t openMode_local;
  ma_device_id *pDeviceID_local;
  ma_device_type deviceType_local;
  ma_share_mode shareMode_local;
  ma_context *pContext_local;
  
  pPCM = (ma_snd_pcm_t *)ppPCM;
  ppPCM_local._4_4_ = openMode;
  pmStack_28 = pDeviceID;
  pDeviceID_local._0_4_ = deviceType;
  pDeviceID_local._4_4_ = shareMode;
  _deviceType_local = pContext;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3a46,
                  "ma_result ma_context_open_pcm__alsa(ma_context *, ma_share_mode, ma_device_type, const ma_device_id *, int, ma_snd_pcm_t **)"
                 );
  }
  if (ppPCM == (ma_snd_pcm_t **)0x0) {
    __assert_fail("ppPCM != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3a47,
                  "ma_result ma_context_open_pcm__alsa(ma_context *, ma_share_mode, ma_device_type, const ma_device_id *, int, ma_snd_pcm_t **)"
                 );
  }
  *ppPCM = (ma_snd_pcm_t *)0x0;
  _isDeviceOpen = 0;
  uVar2 = (uint)(deviceType != ma_device_type_playback);
  if (pDeviceID == (ma_device_id *)0x0) {
    memcpy(deviceID.wasapi + 0x3e,&DAT_002da9d0,0x38);
    if (pDeviceID_local._4_4_ == ma_share_mode_exclusive) {
      defaultDeviceNames[0] = "hw";
      defaultDeviceNames[1] = "hw:0";
      defaultDeviceNames[2] = "hw:0,0";
    }
    else {
      if ((ma_device_type)pDeviceID_local == ma_device_type_playback) {
        defaultDeviceNames[0] = "dmix";
        defaultDeviceNames[1] = "dmix:0";
        defaultDeviceNames[2] = "dmix:0,0";
      }
      else {
        defaultDeviceNames[0] = "dsnoop";
        defaultDeviceNames[1] = "dsnoop:0";
        defaultDeviceNames[2] = "dsnoop:0,0";
      }
      defaultDeviceNames[3] = "hw";
      defaultDeviceNames[4] = "hw:0";
      defaultDeviceNames[5] = "hw:0,0";
    }
    bVar1 = false;
    for (defaultDeviceNames[6] = (char *)0x0; defaultDeviceNames[6] < (char *)0x7;
        defaultDeviceNames[6] = defaultDeviceNames[6] + 1) {
      if (((defaultDeviceNames[(long)(defaultDeviceNames[6] + -1)] != (char *)0x0) &&
          (*defaultDeviceNames[(long)(defaultDeviceNames[6] + -1)] != '\0')) &&
         (iVar3 = (*(_deviceType_local->field_14).alsa.snd_pcm_open)
                            (&isDeviceOpen,defaultDeviceNames[(long)(defaultDeviceNames[6] + -1)],
                             (ulong)uVar2,(ulong)(uint)ppPCM_local._4_4_), iVar3 == 0)) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      pmVar6 = ma_context_get_log(_deviceType_local);
      ma_log_postf(pmVar6,1,
                   "[ALSA] snd_pcm_open() failed when trying to open an appropriate default device."
                  );
      return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
    }
  }
  else {
    memcpy(&local_188,pDeviceID,0x100);
    local_18c = -0x13;
    if (local_188 == ':') {
      if (local_187 == '\0') {
        local_188 = '\0';
      }
      if (pDeviceID_local._4_4_ == ma_share_mode_shared) {
        if ((ma_device_type)pDeviceID_local == ma_device_type_playback) {
          ma_strcpy_s(local_298,0x100,"dmix");
        }
        else {
          ma_strcpy_s(local_298,0x100,"dsnoop");
        }
        wVar4 = ma_strcat_s(local_298,0x100,&local_188);
        if (wVar4 == L'\0') {
          local_18c = (*(_deviceType_local->field_14).alsa.snd_pcm_open)
                                (&isDeviceOpen,local_298,(ulong)uVar2,(ulong)(uint)ppPCM_local._4_4_
                                );
        }
      }
      if (local_18c != 0) {
        ma_strcpy_s(local_298,0x100,"hw");
        wVar4 = ma_strcat_s(local_298,0x100,&local_188);
        if (wVar4 == L'\0') {
          local_18c = (*(_deviceType_local->field_14).alsa.snd_pcm_open)
                                (&isDeviceOpen,local_298,(ulong)uVar2,(ulong)(uint)ppPCM_local._4_4_
                                );
        }
      }
    }
    else {
      local_18c = (*(_deviceType_local->field_14).alsa.snd_pcm_open)
                            (&isDeviceOpen,&local_188,(ulong)uVar2,(ulong)(uint)ppPCM_local._4_4_);
    }
    if (local_18c < 0) {
      pmVar6 = ma_context_get_log(_deviceType_local);
      ma_log_postf(pmVar6,1,"[ALSA] snd_pcm_open() failed.");
      mVar5 = ma_result_from_errno(-local_18c);
      return mVar5;
    }
  }
  *(undefined8 *)pPCM = _isDeviceOpen;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_context_open_pcm__alsa(ma_context* pContext, ma_share_mode shareMode, ma_device_type deviceType, const ma_device_id* pDeviceID, int openMode, ma_snd_pcm_t** ppPCM)
{
    ma_snd_pcm_t* pPCM;
    ma_snd_pcm_stream_t stream;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(ppPCM != NULL);

    *ppPCM = NULL;
    pPCM = NULL;

    stream = (deviceType == ma_device_type_playback) ? MA_SND_PCM_STREAM_PLAYBACK : MA_SND_PCM_STREAM_CAPTURE;

    if (pDeviceID == NULL) {
        ma_bool32 isDeviceOpen;
        size_t i;

        /*
        We're opening the default device. I don't know if trying anything other than "default" is necessary, but it makes
        me feel better to try as hard as we can get to get _something_ working.
        */
        const char* defaultDeviceNames[] = {
            "default",
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
        };

        if (shareMode == ma_share_mode_exclusive) {
            defaultDeviceNames[1] = "hw";
            defaultDeviceNames[2] = "hw:0";
            defaultDeviceNames[3] = "hw:0,0";
        } else {
            if (deviceType == ma_device_type_playback) {
                defaultDeviceNames[1] = "dmix";
                defaultDeviceNames[2] = "dmix:0";
                defaultDeviceNames[3] = "dmix:0,0";
            } else {
                defaultDeviceNames[1] = "dsnoop";
                defaultDeviceNames[2] = "dsnoop:0";
                defaultDeviceNames[3] = "dsnoop:0,0";
            }
            defaultDeviceNames[4] = "hw";
            defaultDeviceNames[5] = "hw:0";
            defaultDeviceNames[6] = "hw:0,0";
        }

        isDeviceOpen = MA_FALSE;
        for (i = 0; i < ma_countof(defaultDeviceNames); ++i) {
            if (defaultDeviceNames[i] != NULL && defaultDeviceNames[i][0] != '\0') {
                if (((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, defaultDeviceNames[i], stream, openMode) == 0) {
                    isDeviceOpen = MA_TRUE;
                    break;
                }
            }
        }

        if (!isDeviceOpen) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] snd_pcm_open() failed when trying to open an appropriate default device.");
            return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
        }
    } else {
        /*
        We're trying to open a specific device. There's a few things to consider here:

        miniaudio recongnizes a special format of device id that excludes the "hw", "dmix", etc. prefix. It looks like this: ":0,0", ":0,1", etc. When
        an ID of this format is specified, it indicates to miniaudio that it can try different combinations of plugins ("hw", "dmix", etc.) until it
        finds an appropriate one that works. This comes in very handy when trying to open a device in shared mode ("dmix"), vs exclusive mode ("hw").
        */

        /* May end up needing to make small adjustments to the ID, so make a copy. */
        ma_device_id deviceID = *pDeviceID;
        int resultALSA = -ENODEV;

        if (deviceID.alsa[0] != ':') {
            /* The ID is not in ":0,0" format. Use the ID exactly as-is. */
            resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, deviceID.alsa, stream, openMode);
        } else {
            char hwid[256];

            /* The ID is in ":0,0" format. Try different plugins depending on the shared mode. */
            if (deviceID.alsa[1] == '\0') {
                deviceID.alsa[0] = '\0';  /* An ID of ":" should be converted to "". */
            }

            if (shareMode == ma_share_mode_shared) {
                if (deviceType == ma_device_type_playback) {
                    ma_strcpy_s(hwid, sizeof(hwid), "dmix");
                } else {
                    ma_strcpy_s(hwid, sizeof(hwid), "dsnoop");
                }

                if (ma_strcat_s(hwid, sizeof(hwid), deviceID.alsa) == 0) {
                    resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, hwid, stream, openMode);
                }
            }

            /* If at this point we still don't have an open device it means we're either preferencing exclusive mode or opening with "dmix"/"dsnoop" failed. */
            if (resultALSA != 0) {
                ma_strcpy_s(hwid, sizeof(hwid), "hw");
                if (ma_strcat_s(hwid, sizeof(hwid), deviceID.alsa) == 0) {
                    resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, hwid, stream, openMode);
                }
            }
        }

        if (resultALSA < 0) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] snd_pcm_open() failed.");
            return ma_result_from_errno(-resultALSA);
        }
    }

    *ppPCM = pPCM;
    return MA_SUCCESS;
}